

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferTest::iterate(MutableRenderBufferTest *this)

{
  deUint32 dVar1;
  Library *egl;
  char *description;
  deUint32 dVar2;
  qpTestResult testResult;
  TestContext *this_00;
  deUint32 backBufferPixel;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  for (dVar2 = 1; dVar2 != 5; dVar2 = dVar2 + 1) {
    drawAndSwap(this,egl,dVar2,false);
  }
  (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3086,0x3085);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar2,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0xe7);
  drawAndSwap(this,egl,5,false);
  dVar2 = 6;
  do {
    if (dVar2 == 10) {
      (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3086,0x3084);
      dVar2 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar2,
                       "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_BACK_BUFFER)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                       ,0xfd);
      for (dVar2 = 10; dVar2 != 0xe; dVar2 = dVar2 + 1) {
        drawAndSwap(this,egl,dVar2,false);
      }
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_0023c738:
      tcu::TestContext::setTestResult(this_00,testResult,description);
      return STOP;
    }
    backBufferPixel = 0xffffffff;
    dVar1 = drawAndSwap(this,egl,dVar2,true);
    (*(this->m_gl).readPixels)(0,0,1,1,0x1908,0x1401,&backBufferPixel);
    if (backBufferPixel != dVar1) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Surface isn\'t single-buffered";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_0023c738;
    }
    dVar2 = dVar2 + 1;
  } while( true );
}

Assistant:

TestCase::IterateResult MutableRenderBufferTest::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	int frameNumber = 1;

	// run a few back-buffered frames even if we can't verify their contents
	for (; frameNumber < 5; frameNumber++)
	{
		drawAndSwap(egl, frameNumber, false);
	}

	// switch to single-buffer rendering
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER));

	// Use eglSwapBuffers for the first frame
	drawAndSwap(egl, frameNumber, false);
	frameNumber++;

	// test a few single-buffered frames
	for (; frameNumber < 10; frameNumber++)
	{
		deUint32 backBufferPixel = 0xFFFFFFFF;
		deUint32 frontBufferPixel = drawAndSwap(egl, frameNumber, true);
		m_gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &backBufferPixel);

		// when single buffered, front-buffer == back-buffer
		if (backBufferPixel != frontBufferPixel)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface isn't single-buffered");
			return STOP;
		}
	}

	// switch back to back-buffer rendering
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_BACK_BUFFER));

	// run a few back-buffered frames even if we can't verify their contents
	for (; frameNumber < 14; frameNumber++)
	{
		drawAndSwap(egl, frameNumber, false);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}